

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void testJacobiEigenSolver<Imath_3_2::Matrix33<float>>(Matrix33<float> *A)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint i;
  long lVar8;
  undefined8 *puVar9;
  float *pfVar10;
  uint i_1;
  float (*pafVar11) [3];
  uint j;
  long lVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  float threshold;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  TV S;
  Matrix33<float> tmp;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  Vec3 local_f4 [12];
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float local_68 [12];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  
  fVar14 = 0.0;
  lVar8 = 0;
  pafVar11 = (float (*) [3])A;
  do {
    lVar12 = 0;
    fVar15 = fVar14;
    do {
      fVar14 = ABS((*(float (*) [3])*pafVar11)[lVar12]);
      if (fVar14 <= fVar15) {
        fVar14 = fVar15;
      }
      lVar12 = lVar12 + 1;
      fVar15 = fVar14;
    } while (lVar12 != 3);
    lVar8 = lVar8 + 1;
    pafVar11 = pafVar11 + 1;
  } while (lVar8 != 3);
  fVar15 = 1.1920929e-07;
  if (1.1920929e-07 <= fVar14) {
    fVar15 = fVar14;
  }
  threshold = fVar15 * 100.0 * 1.1920929e-07;
  local_38 = *(undefined8 *)A->x[0];
  uStack_30 = *(undefined8 *)(A->x[0] + 2);
  local_28 = *(undefined8 *)(A->x[1] + 1);
  uStack_20 = *(undefined8 *)A->x[2];
  local_18 = A->x[2][2];
  local_68[0] = 1.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[4] = 1.0;
  local_68[5] = 0.0;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[8] = 1.0;
  Imath_3_2::jacobiEigenSolver<float>
            ((Matrix33 *)&local_38,local_f4,(Matrix33 *)local_68,1.1920929e-07);
  verifyOrthonormal<Imath_3_2::Matrix33<float>>((Matrix33<float> *)local_68,threshold);
  fVar7 = local_68[8];
  fVar14 = local_68[0];
  fVar15 = local_68[1];
  fVar3 = local_68[4];
  fVar4 = local_68[5];
  fVar6 = local_68[7];
  fVar5 = local_68[6];
  fVar2 = local_68[3];
  fVar1 = local_68[2];
  if (threshold <=
      ABS((local_68[3] * local_68[7] - local_68[6] * local_68[4]) * local_68[2] +
          (local_68[4] * local_68[8] - local_68[7] * local_68[5]) * local_68[0] +
          (local_68[5] * local_68[6] - local_68[8] * local_68[3]) * local_68[1]) + -1.0) {
    __assert_fail("abs (V.determinant ()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x67,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
  }
  puVar9 = &local_188;
  local_188 = 0x3f800000;
  uStack_180 = 0;
  local_178 = 0x3f800000;
  uStack_170 = 0;
  local_168 = 1.0;
  lVar8 = 0;
  do {
    lVar12 = 0;
    do {
      uVar13 = 0;
      if (lVar8 == lVar12) {
        uVar13 = *(undefined4 *)(local_f4 + lVar8 * 4);
      }
      *(undefined4 *)((long)puVar9 + lVar12 * 4) = uVar13;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar8 = lVar8 + 1;
    puVar9 = (undefined8 *)((long)puVar9 + 0xc);
  } while (lVar8 != 3);
  local_c8 = ZEXT416((uint)fVar4);
  local_b8 = ZEXT416((uint)fVar2);
  local_158 = ZEXT416((uint)fVar15);
  local_148 = ZEXT416((uint)fVar1);
  local_a8 = ZEXT416((uint)fVar3);
  local_138 = ZEXT416((uint)fVar14);
  local_128 = ZEXT416((uint)fVar5);
  local_118 = ZEXT416((uint)fVar6);
  local_108 = ZEXT416((uint)fVar7);
  fVar19 = A->x[1][1];
  fVar20 = A->x[1][2];
  fVar21 = A->x[1][0];
  fVar16 = A->x[2][1];
  fVar17 = A->x[2][2];
  fVar18 = A->x[2][0];
  if (ABS(A->x[0][2] * (fVar21 * fVar16 - fVar18 * fVar19) +
          A->x[0][0] * (fVar19 * fVar17 - fVar16 * fVar20) +
          A->x[0][1] * (fVar20 * fVar18 - fVar17 * fVar21)) -
      ABS((float)uStack_180 *
          (uStack_180._4_4_ * uStack_170._4_4_ - (float)uStack_170 * (float)local_178) +
          (float)local_188 * ((float)local_178 * local_168 - uStack_170._4_4_ * local_178._4_4_) +
          local_188._4_4_ * (local_178._4_4_ * (float)uStack_170 - local_168 * uStack_180._4_4_)) <
      threshold) {
    local_d8 = fVar7 * (float)uStack_170 + fVar5 * (float)local_188 + fVar6 * uStack_180._4_4_;
    uStack_d4 = 0;
    uStack_d0 = 0;
    uStack_cc = 0;
    local_e8 = fVar7 * uStack_170._4_4_ + fVar5 * local_188._4_4_ + fVar6 * (float)local_178;
    uStack_e4 = 0;
    uStack_e0 = 0;
    uStack_dc = 0;
    fVar20 = fVar7 * local_168 + fVar5 * (float)uStack_180 + fVar6 * local_178._4_4_;
    fVar21 = (float)uStack_170 * fVar1 + (float)local_188 * fVar14 + uStack_180._4_4_ * fVar15;
    fVar22 = (float)uStack_170 * fVar4 + (float)local_188 * fVar2 + uStack_180._4_4_ * fVar3;
    fVar16 = uStack_170._4_4_ * fVar1 + local_188._4_4_ * fVar14 + (float)local_178 * fVar15;
    fVar17 = uStack_170._4_4_ * fVar4 + local_188._4_4_ * fVar2 + (float)local_178 * fVar3;
    fVar18 = local_168 * fVar1 + (float)uStack_180 * fVar14 + local_178._4_4_ * fVar15;
    fVar19 = local_168 * fVar4 + (float)uStack_180 * fVar2 + local_178._4_4_ * fVar3;
    pfVar10 = &local_98;
    local_98 = fVar1 * fVar18 + fVar14 * fVar21 + fVar15 * fVar16;
    fStack_94 = fVar4 * fVar18 + fVar2 * fVar21 + fVar3 * fVar16;
    fStack_90 = fVar7 * fVar18 + fVar5 * fVar21 + fVar6 * fVar16;
    fStack_8c = fVar1 * fVar19 + fVar14 * fVar22 + fVar15 * fVar17;
    local_88 = fVar4 * fVar19 + fVar2 * fVar22 + fVar17 * fVar3;
    fStack_84 = fVar7 * fVar19 + fVar5 * fVar22 + fVar17 * fVar6;
    fStack_80 = fVar1 * fVar20 + fVar14 * local_d8 + local_e8 * fVar15;
    fStack_7c = fVar4 * fVar20 + fVar2 * local_d8 + local_e8 * fVar3;
    local_78 = fVar20 * fVar7 + local_d8 * fVar5 + local_e8 * fVar6;
    lVar8 = 0;
    do {
      lVar12 = 0;
      do {
        if (threshold <= ABS((*(float (*) [3])*(float (*) [3])A)[lVar12] - pfVar10[lVar12])) {
          __assert_fail("abs (A[i][j] - MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x79,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar8 = lVar8 + 1;
      A = (Matrix33<float> *)((long)A + 0xc);
      pfVar10 = pfVar10 + 3;
    } while (lVar8 != 3);
    return;
  }
  __assert_fail("abs (A.determinant ()) - abs (MS.determinant ()) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x72,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<float>]");
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}